

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memplumber.cpp
# Opt level: O3

void __thiscall
MemPlumberInternal::checkLeaks
          (MemPlumberInternal *this,size_t *memLeakCount,uint64_t *memLeakSize,bool verbose,
          char *fileDumperName,bool append)

{
  FILE *__stream;
  undefined7 in_register_00000009;
  new_ptr_list_t *pnVar1;
  int index;
  long lVar2;
  
  __stream = (FILE *)0x0;
  *memLeakCount = 0;
  *memLeakSize = 0;
  if ((int)CONCAT71(in_register_00000009,verbose) != 0) {
    __stream = (FILE *)openFile(this,fileDumperName,append);
  }
  lVar2 = 0;
  do {
    for (pnVar1 = this->m_PointerListHashtable[lVar2]; pnVar1 != (new_ptr_list_t *)0x0;
        pnVar1 = pnVar1->next) {
      *memLeakCount = *memLeakCount + 1;
      *memLeakSize = *memLeakSize + pnVar1->size;
      if (verbose) {
        fprintf(__stream,"Found leaked object at 0x%p (size %d[bytes]) allocated in: %s:%d\n",
                pnVar1 + 1,(ulong)(uint)pnVar1->size,pnVar1->file,(ulong)(uint)pnVar1->line);
      }
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x4000);
  closeFile(this,(FILE *)__stream);
  return;
}

Assistant:

void checkLeaks(size_t& memLeakCount, uint64_t& memLeakSize, bool verbose, const char* fileDumperName, bool append) {

        memLeakCount = 0;
        memLeakSize = 0;

        FILE* dumper = NULL;
        if (verbose) {
            dumper = openFile(fileDumperName, append);
        }

        // go over all buckets in the hashmap
        for (int index = 0; index < MEMPLUMBER_HASHTABLE_SIZE; ++index) {
            new_ptr_list_t* metaDataBucketLinkedListElement = m_PointerListHashtable[index];

            // if bucket is empty - continue
            if (metaDataBucketLinkedListElement == NULL) {
                continue;
            }

            // go over all of the elements in the link list in this bucket
            while (metaDataBucketLinkedListElement != NULL) {

                memLeakCount++;
                memLeakSize += (uint64_t)metaDataBucketLinkedListElement->size;

                if (verbose) {
                    fprintf(dumper, "Found leaked object at 0x%p (size %d[bytes]) allocated in: %s:%d\n",
                        (char*) metaDataBucketLinkedListElement + sizeof(new_ptr_list_t), 
                        (int) metaDataBucketLinkedListElement->size,
                        metaDataBucketLinkedListElement->file, 
                        metaDataBucketLinkedListElement->line);
                }

                // go to the next item on the list
                metaDataBucketLinkedListElement = metaDataBucketLinkedListElement->next;
            }
        }

        closeFile(dumper);
    }